

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeSlice(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  string *psVar3;
  Type *pTVar4;
  NeuralNetworkLayer *this;
  SplitLayerParams *pSVar5;
  uint64 uVar6;
  void **ppvVar7;
  SliceParameter *pSVar8;
  long lVar9;
  long lVar10;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_50;
  
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     (1 < (pTVar4->top_).super_RepeatedPtrFieldBase.current_size_)) {
    lVar10 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_d8,"Must have 1 input and more than 1 output",(allocator *)&local_b8
              );
    errorInCaffeProto(&local_d8,(pTVar4->name_).ptr_,(pTVar4->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_d8);
    lVar10 = (long)(pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar4->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  for (lVar9 = 0; lVar10 * 8 != lVar9; lVar9 = lVar9 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar7 + lVar9));
  }
  pRVar2 = (pTVar4->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  iVar1 = (pTVar4->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar10 = 0; (long)iVar1 * 8 != lVar10; lVar10 = lVar10 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar7 + lVar10));
  }
  convertCaffeMetadata
            ((pTVar4->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pSVar8 = pTVar4->slice_param_;
  if (pSVar8 == (SliceParameter *)0x0) {
    pSVar8 = (SliceParameter *)&caffe::_SliceParameter_default_instance_;
  }
  if (pSVar8->axis_ != 1) {
    std::__cxx11::string::string((string *)&local_d8,"axis",&local_da);
    psVar3 = (pTVar4->name_).ptr_;
    std::__cxx11::string::string((string *)&local_b8,"Slice",&local_d9);
    std::__cxx11::to_string(&local_50,pSVar8->axis_);
    unsupportedCaffeParrameterWithOption(&local_d8,psVar3,&local_b8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((pSVar8->slice_point_).current_size_ != 0) {
    std::__cxx11::string::string((string *)&local_d8,"slice_point",(allocator *)&local_50);
    psVar3 = (pTVar4->name_).ptr_;
    std::__cxx11::string::string((string *)&local_b8,"Slice",&local_da);
    unsupportedCaffeParrameter(&local_d8,psVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  pSVar5 = CoreML::Specification::NeuralNetworkLayer::mutable_split(this);
  uVar6 = (uint64)(pTVar4->top_).super_RepeatedPtrFieldBase.current_size_;
  if (-1 < (long)uVar6) {
    pSVar5->noutputs_ = uVar6;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&top);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&bottom);
    return;
  }
  __assert_fail("topSize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Slice.cpp"
                ,0x39,
                "void CoreMLConverter::convertCaffeSlice(CoreMLConverter::ConvertLayerParameters)");
}

Assistant:

void CoreMLConverter::convertCaffeSlice(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() <= 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and more than 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);

    const caffe::SliceParameter& caffeLayerParams = caffeLayer.slice_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis()!=1){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(), "Slice",std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.slice_point_size()!=0) {
        CoreMLConverter::unsupportedCaffeParrameter("slice_point", caffeLayer.name(), "Slice");
    }
    //***************************************************************
    
    Specification::SplitLayerParams* specLayerParams = specLayer->mutable_split();

    int topSize = caffeLayer.top_size();
    assert(topSize >= 0);
    specLayerParams->set_noutputs(static_cast<uint64_t>(topSize));
}